

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmMakefileTargetGenerator::DriveCustomCommands
          (cmMakefileTargetGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *depends)

{
  cmGeneratorTarget *this_00;
  cmMakefile *this_01;
  pointer v;
  bool bVar1;
  string *config;
  reference ppcVar2;
  cmCustomCommand *cc_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *r;
  string local_158;
  undefined1 local_138 [8];
  cmCustomCommandGenerator ccg;
  cmCustomCommand *cc;
  cmSourceFile *source;
  iterator __end1;
  iterator __begin1;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *__range1;
  allocator<char> local_51;
  string local_50;
  undefined1 local_30 [8];
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *depends_local;
  cmMakefileTargetGenerator *this_local;
  
  sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)depends;
  std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::vector
            ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_30);
  this_00 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  this_01 = (this->super_cmCommonTargetGenerator).Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"CMAKE_BUILD_TYPE",&local_51);
  config = cmMakefile::GetSafeDefinition(this_01,&local_50);
  cmGeneratorTarget::GetSourceFiles
            (this_00,(vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_30,config);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  __end1 = std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::begin
                     ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_30);
  source = (cmSourceFile *)
           std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::end
                     ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_30);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                                *)&source);
    if (!bVar1) break;
    ppcVar2 = __gnu_cxx::
              __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
              ::operator*(&__end1);
    cc_00 = cmSourceFile::GetCustomCommand(*ppcVar2);
    ccg.WorkingDirectory.field_2._8_8_ = cc_00;
    if (cc_00 != (cmCustomCommand *)0x0) {
      std::__cxx11::string::string
                ((string *)&local_158,(string *)&(this->super_cmCommonTargetGenerator).ConfigName);
      cmCustomCommandGenerator::cmCustomCommandGenerator
                ((cmCustomCommandGenerator *)local_138,cc_00,&local_158,
                 (cmLocalGenerator *)this->LocalGenerator);
      std::__cxx11::string::~string((string *)&local_158);
      v = sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage;
      r = cmCustomCommandGenerator::GetOutputs_abi_cxx11_((cmCustomCommandGenerator *)local_138);
      cmAppend<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)v,r);
      cmCustomCommandGenerator::~cmCustomCommandGenerator((cmCustomCommandGenerator *)local_138);
    }
    __gnu_cxx::
    __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
    ::operator++(&__end1);
  }
  std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~vector
            ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_30);
  return;
}

Assistant:

void cmMakefileTargetGenerator::DriveCustomCommands(
  std::vector<std::string>& depends)
{
  // Depend on all custom command outputs.
  std::vector<cmSourceFile*> sources;
  this->GeneratorTarget->GetSourceFiles(
    sources, this->Makefile->GetSafeDefinition("CMAKE_BUILD_TYPE"));
  for (cmSourceFile* source : sources) {
    if (cmCustomCommand* cc = source->GetCustomCommand()) {
      cmCustomCommandGenerator ccg(*cc, this->ConfigName,
                                   this->LocalGenerator);
      cmAppend(depends, ccg.GetOutputs());
    }
  }
}